

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardConfigTab.cpp
# Opt level: O0

void __thiscall BindingEdit::setKey(BindingEdit *this,int key)

{
  iterator pvVar1;
  iterator __last;
  Key *pKVar2;
  Key local_2c;
  Key *local_28;
  Key *existing;
  Key *dest;
  BindingEdit *pBStack_10;
  int key_local;
  BindingEdit *this_local;
  
  dest._4_4_ = key;
  pBStack_10 = this;
  existing = cursorKey(this);
  if (*existing != dest._4_4_) {
    if (dest._4_4_ != 0) {
      pvVar1 = std::array<Qt::Key,_49UL>::begin(&this->mBindings);
      __last = std::array<Qt::Key,_49UL>::end(&this->mBindings);
      local_2c = dest._4_4_;
      pKVar2 = std::find<Qt::Key*,Qt::Key>(pvVar1,__last,&local_2c);
      local_28 = pKVar2;
      pvVar1 = std::array<Qt::Key,_49UL>::end(&this->mBindings);
      if (pKVar2 != pvVar1) {
        *local_28 = *existing;
      }
    }
    *existing = dest._4_4_;
    bindingsChanged(this);
    QWidget::update();
  }
  return;
}

Assistant:

void setKey(int key) {
        auto &dest = cursorKey();
        if (dest != key) {

            if (key) {
                // check if this key is already bound
                auto existing = std::find(mBindings.begin(), mBindings.end(), (Qt::Key)key);
                if (existing != mBindings.end()) {
                    // key is bound, overwrite with the cursor's old value
                    *existing = dest;
                }
            }
            dest = (Qt::Key)key;

            emit bindingsChanged();
            update();
        }
    }